

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

void __thiscall
rcc::shared_ptr<TestSharedPtrObj>::shared_ptr
          (shared_ptr<TestSharedPtrObj> *this,weak_ptr<TestSharedPtrObj> *other)

{
  IObjectSharedState *pIVar1;
  IObject *pIVar2;
  TestSharedPtrObj *pTVar3;
  
  this->obj_state = (IObjectSharedState *)0x0;
  this->obj_pointer = (TestSharedPtrObj *)0x0;
  pIVar1 = other->obj_state;
  this->obj_state = pIVar1;
  if (pIVar1 != (IObjectSharedState *)0x0) {
    pIVar2 = IObjectSharedState::GetIObject(pIVar1);
    if (pIVar2 == (IObject *)0x0) {
      this->obj_pointer = (TestSharedPtrObj *)0x0;
    }
    else {
      pTVar3 = (TestSharedPtrObj *)
               __dynamic_cast(pIVar2,&IObject::typeinfo,&TestSharedPtrObj::typeinfo,0);
      this->obj_pointer = pTVar3;
      pIVar1 = this->obj_state;
      if (pIVar1 != (IObjectSharedState *)0x0 && pTVar3 != (TestSharedPtrObj *)0x0) {
        other->obj_state = (IObjectSharedState *)0x0;
        IObjectSharedState::IncrementObject(pIVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

shared_ptr(weak_ptr<T>&& other){
            this->obj_state = other.obj_state;
            if (obj_state)
                obj_pointer = dynamic_cast<T*>(this->obj_state->GetIObject());
            if(obj_state && obj_pointer){
                other.obj_state = nullptr;
                obj_state->IncrementObject();
            }
        }